

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall HighsDomain::ConflictSet::pushQueue(ConflictSet *this,iterator domchg)

{
  iterator iVar1;
  iterator iVar2;
  vector<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
  *in_stack_ffffffffffffffc8;
  _Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg> *in_stack_ffffffffffffffd8;
  vector<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
  *in_stack_ffffffffffffffe0;
  
  std::
  vector<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>>>
  ::emplace_back<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>&>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  iVar1 = std::
          vector<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
          ::begin(in_stack_ffffffffffffffc8);
  iVar2 = std::
          vector<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
          ::end(in_stack_ffffffffffffffc8);
  std::
  push_heap<__gnu_cxx::__normal_iterator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>*,std::vector<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>>>>,HighsDomain::ConflictSet::pushQueue(std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>)::__0>
            (iVar1._M_current,iVar2._M_current);
  return;
}

Assistant:

void HighsDomain::ConflictSet::pushQueue(
    std::set<LocalDomChg>::iterator domchg) {
  resolveQueue.emplace_back(domchg);
  std::push_heap(
      resolveQueue.begin(), resolveQueue.end(),
      [](const std::set<LocalDomChg>::iterator& a,
         const std::set<LocalDomChg>::iterator& b) { return a->pos < b->pos; });
}